

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::generateInternalFormatTextureGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  deUint32 internalFormat;
  bool bVar1;
  int iVar2;
  TextureFormat TVar3;
  char *__rhs;
  GLenum GVar4;
  long lVar5;
  TextureLevelSpec level;
  undefined1 local_100 [56];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  long local_88;
  code *local_80;
  GLenum local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  GVar4 = 0x8518;
  if (target != 0x8513) {
    GVar4 = target;
  }
  local_c8._M_p = (pointer)&local_b8;
  local_100._20_4_ = 0x100;
  local_100[0x18] = false;
  local_100._32_8_ = (pointer)0x0;
  local_100._40_8_ = (pointer)0x0;
  local_100._48_8_ = (pointer)0x0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_100[8] = true;
  local_100[9] = true;
  local_100._12_4_ = 0;
  local_100._16_4_ = 0;
  local_50._M_dataplus._M_p = (pointer)glu::getTextureTargetName;
  local_100._0_4_ = target;
  local_100._4_4_ = GVar4;
  local_50._M_string_length._0_4_ = target;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&local_50);
  std::operator+(&local_70,&local_a8,", initial values");
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(group,(value_type *)local_100);
  TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_100);
  lVar5 = 0;
  do {
    if (lVar5 == 0xd8) {
      if (((target != 0x8c2a) && (target != 0x9100)) && (target != 0x9102)) {
        local_100._12_4_ = 0;
        local_100._16_4_ = 0;
        local_100._20_4_ = 0x100;
        local_100[0x18] = false;
        local_100._32_8_ = (pointer)0x0;
        local_100._40_8_ = (pointer)0x0;
        local_100._48_8_ = (pointer)0x0;
        local_c8._M_p = (pointer)&local_b8;
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_100[8] = false;
        local_100[9] = true;
        level._0_8_ = glu::getTextureTargetName;
        level.depth = target;
        local_100._0_4_ = target;
        local_100._4_4_ = GVar4;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_a8,&level);
        std::operator+(&local_70,&local_a8,", internal format GL_RGBA8, mip level 3");
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_a8);
        local_50._M_dataplus._M_p = (pointer)0x2000000020;
        bVar1 = textureTypeHasDepth(target);
        local_50._M_string_length._0_4_ = (uint)bVar1 + (uint)bVar1 * 4 + 1;
        local_50._12_8_ = 0x805800000003;
        local_50.field_2._M_local_buf[4] = '\0';
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
        ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                     *)(local_100 + 0x20),(value_type *)&local_50);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
        ::push_back(group,(value_type *)local_100);
        TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_100);
      }
      return;
    }
    internalFormat =
         *(deUint32 *)((long)generateInternalFormatTextureGenerationGroup::internalFormats + lVar5);
    TVar3 = glu::mapGLInternalFormat(internalFormat);
    if (target == 0x806f) {
      if ((TVar3.order != D) && (TVar3.order != DS)) goto LAB_0129f40f;
    }
    else if ((target & 0xfffffffd) == 0x9100) {
      if ((((internalFormat - 0x8229 < 0x14) &&
           ((0xfff05U >> (internalFormat - 0x8229 & 0x1f) & 1) != 0)) ||
          ((internalFormat - 0x8d62 < 0x2d &&
           ((0x104104104001U >> ((ulong)(internalFormat - 0x8d62) & 0x3f) & 1) != 0)))) ||
         (((internalFormat - 0x8051 < 9 && ((0x1e1U >> (internalFormat - 0x8051 & 0x1f) & 1) != 0))
          || ((internalFormat - 0x81a5 < 2 ||
              ((((internalFormat - 0x8cac < 2 || (internalFormat == 0x88f0)) ||
                (internalFormat == 0x8c43)) || (internalFormat == 0x906f)))))))) {
LAB_0129f40f:
        if (((((internalFormat - 0x8229 < 0x14) &&
              ((0xffff5U >> (internalFormat - 0x8229 & 0x1f) & 1) != 0)) ||
             ((internalFormat - 0x8d70 < 0x1f &&
              ((0x410c1043U >> (internalFormat - 0x8d70 & 0x1f) & 1) != 0)))) ||
            ((internalFormat - 0x8814 < 7 && ((0x43U >> (internalFormat - 0x8814 & 0x1f) & 1) != 0))
            )) || (internalFormat == 0x8058)) {
          local_88 = lVar5;
          iVar2 = getPixelSize(internalFormat);
          local_100._16_4_ = 0;
          local_100._20_4_ = 0x100;
          local_100[0x18] = false;
          local_100._32_8_ = (pointer)0x0;
          local_100._40_8_ = (pointer)0x0;
          local_100._48_8_ = (pointer)0x0;
          local_c8._M_p = (pointer)&local_b8;
          local_c0 = 0;
          local_b8._M_local_buf[0] = '\0';
          level.width = 0;
          level.height = 0;
          level.depth = 0;
          level.level = 0;
          level.internalFormat = 0x1908;
          level.compressed = false;
          local_100[8] = true;
          local_100[9] = true;
          local_80 = glu::getTextureTargetName;
          local_100._0_4_ = target;
          local_100._4_4_ = GVar4;
          local_100._12_4_ = (uint)((target & 0xfffffffd) == 0x9100);
          local_78 = target;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_80);
          std::operator+(&local_a8,&local_50,", internal format ");
          __rhs = glu::getTextureFormatName(internalFormat);
          std::operator+(&local_70,&local_a8,__rhs);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_50);
          if (target == 0x8c2a) {
            local_100._16_4_ = 0;
            local_100._20_4_ = iVar2 * 0x21 + -1;
            local_100[0x18] = true;
LAB_0129f59c:
            level.height = 1;
          }
          else {
            level.height = 0x20;
            if ((((target != 0xde1) && (target != 0x806f)) && (target != 0x8513)) &&
               (((target != 0x8c1a && (target != 0x9009)) &&
                ((target != 0x9100 && (target != 0x9102)))))) goto LAB_0129f59c;
          }
          level.width = 0x20;
          bVar1 = textureTypeHasDepth(target);
          level.level = 0;
          level.depth = (uint)bVar1 + (uint)bVar1 * 4 + 1;
          level.compressed = false;
          level.internalFormat = internalFormat;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                       *)(local_100 + 0x20),&level);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
          ::push_back(group,(TextureGenerationSpec *)local_100);
          TextureGenerationSpec::~TextureGenerationSpec((TextureGenerationSpec *)local_100);
          lVar5 = local_88;
        }
      }
    }
    else if (target != 0x8c2a) goto LAB_0129f40f;
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

static void generateInternalFormatTextureGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// Internal formats
	static const glw::GLenum internalFormats[] =
	{
		GL_R8, GL_R8_SNORM, GL_RG8, GL_RG8_SNORM, GL_RGB8, GL_RGB8_SNORM, GL_RGB565, GL_RGBA4, GL_RGB5_A1,
		GL_RGBA8, GL_RGBA8_SNORM, GL_RGB10_A2, GL_RGB10_A2UI, GL_SRGB8, GL_SRGB8_ALPHA8, GL_R16F, GL_RG16F,
		GL_RGB16F, GL_RGBA16F, GL_R32F, GL_RG32F, GL_RGB32F, GL_RGBA32F, GL_R11F_G11F_B10F, GL_RGB9_E5, GL_R8I,
		GL_R8UI, GL_R16I, GL_R16UI, GL_R32I, GL_R32UI, GL_RG8I, GL_RG8UI, GL_RG16I, GL_RG16UI, GL_RG32I, GL_RG32UI,
		GL_RGB8I, GL_RGB8UI, GL_RGB16I, GL_RGB16UI, GL_RGB32I, GL_RGB32UI, GL_RGBA8I, GL_RGBA8UI, GL_RGBA16I,
		GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI,

		GL_DEPTH_COMPONENT32F, GL_DEPTH_COMPONENT24, GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8, GL_DEPTH24_STENCIL8
	};

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.fixedSamplePos	= true;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// test all formats
	for (int internalFormatNdx = 0; internalFormatNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++internalFormatNdx)
	{
		if (!isLegalFormatForTarget(target, internalFormats[internalFormatNdx]))
			continue;

		const int								baseSize = getPixelSize(internalFormats[internalFormatNdx]);
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= (isMultisampleTarget(target) ? (1) : (0));
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format " + glu::getTextureFormatName(internalFormats[internalFormatNdx]);

		if (target == GL_TEXTURE_BUFFER)
		{
			texGen.texBufferDataOffset	= 0;
			texGen.texBufferDataSize	= 32 * baseSize + (baseSize - 1);
			texGen.bindWholeArray		= true;
		}

		level.width				= 32;
		level.height			= (textureTypeHasHeight(target)) ? (32) : (1);
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 0;
		level.internalFormat	= internalFormats[internalFormatNdx];
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}

	// test mutable rgba8 with mip level 3
	if (targetSupportsMipLevels(target))
	{
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= false;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format GL_RGBA8, mip level 3";

		level.width				= 32;
		level.height			= 32;
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 3;
		level.internalFormat	= GL_RGBA8;
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}
}